

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O3

BlockPointer __thiscall duckdb::MetadataWriter::GetBlockPointer(MetadataWriter *this)

{
  MetadataPointer MVar1;
  BlockManager *pBVar2;
  uint uVar3;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  BlockPointer BVar7;
  
  uVar6 = this->offset;
  if (this->capacity <= uVar6) {
    NextBlock(this);
    uVar6 = this->offset;
  }
  MVar1 = (this->block).pointer;
  pBVar2 = this->manager->block_manager;
  iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar2->block_header_size);
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    (iVar4 - iVar5 >> 6 & 0xfffffffffffffff8);
  BVar7.offset = MVar1._7_1_ * uVar3 + (int)uVar6;
  BVar7.block_id = (ulong)MVar1 & 0xffffffffffffff;
  BVar7.unused_padding = 0;
  return BVar7;
}

Assistant:

BlockPointer MetadataWriter::GetBlockPointer() {
	return MetadataManager::ToBlockPointer(GetMetaBlockPointer(), GetManager().GetMetadataBlockSize());
}